

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra.cc
# Opt level: O1

void __thiscall OutputRedirect::flush(OutputRedirect *this)

{
  int iVar1;
  int *piVar2;
  system_error *this_00;
  string_view message;
  
  do {
    iVar1 = fflush((FILE *)this->file_);
    if (iVar1 != -1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  if (iVar1 == 0) {
    return;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x18);
  piVar2 = __errno_location();
  message.size_ = 0x13;
  message.data_ = "cannot flush stream";
  fmt::v5::system_error::system_error<>(this_00,*piVar2,message);
  __cxa_throw(this_00,&fmt::v5::system_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OutputRedirect::flush() {
#if EOF != -1
# error "FMT_RETRY assumes return value of -1 indicating failure"
#endif
  int result = 0;
  FMT_RETRY(result, fflush(file_));
  if (result != 0)
    throw fmt::system_error(errno, "cannot flush stream");
}